

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfCheckFile.cpp
# Opt level: O1

bool Imf_3_2::anon_unknown_0::checkCoreFile(exr_context_t f,bool reduceMemory,bool reduceTime)

{
  short sVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  bool bVar6;
  pointer puVar7;
  long lVar8;
  bool bVar9;
  long lVar10;
  undefined7 in_register_00000031;
  size_type sVar11;
  long lVar12;
  byte bVar13;
  long lVar14;
  int iVar15;
  int iVar16;
  long lVar17;
  long lVar18;
  ulong uVar19;
  bool bVar20;
  int32_t curtw;
  int32_t lines_per_chunk;
  exr_storage_t store;
  int32_t curth;
  int numparts;
  int32_t levh;
  int32_t levw;
  int32_t levelsy;
  int32_t levelsx;
  vector<unsigned_char,_std::allocator<unsigned_char>_> imgdata;
  exr_attr_box2i_t datawin;
  exr_tile_round_mode_t roundingmode;
  exr_tile_level_mode_t levelmode;
  uint32_t tysz;
  exr_chunk_info_t cinfo;
  exr_decode_pipeline_t decoder;
  int local_2dc;
  uint local_2d8;
  int local_2d4;
  int local_2d0;
  uint local_2cc;
  int local_2c8;
  uint local_2c4;
  int local_2c0;
  int local_2bc;
  int local_2b8;
  int local_2b4;
  int local_2b0;
  int local_2ac;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_2a8;
  int local_288;
  int local_284;
  int local_280;
  int local_27c;
  ulong local_278;
  long local_270;
  undefined1 local_264 [4];
  undefined1 local_260 [4];
  undefined1 local_25c [4];
  undefined8 local_258;
  undefined8 uStack_250;
  undefined8 local_248;
  undefined8 uStack_240;
  undefined8 local_238;
  undefined8 uStack_230;
  undefined8 local_228;
  undefined8 uStack_220;
  long local_210;
  short local_208;
  
  local_2d8 = (uint)CONCAT71(in_register_00000031,reduceMemory);
  iVar2 = exr_get_count(f,&local_2bc);
  bVar9 = true;
  if ((iVar2 == 0) && (bVar9 = 0 < local_2bc, 0 < local_2bc)) {
    local_2c0 = (uint)!reduceTime * 2 + 5;
    local_2d8 = local_2d8 ^ 1;
    local_2c4 = (uint)!reduceTime * 2 + 2;
    iVar2 = 0;
    do {
      iVar3 = exr_get_storage(f,iVar2,&local_2cc);
      bVar6 = true;
      if ((iVar3 == 0) && (bVar6 = false, (local_2cc & 0xfffffffe) != 2)) {
        if (local_2cc == 1) {
          iVar3 = exr_get_data_window(f,iVar2,&local_288);
          if (((iVar3 != 0) ||
              (iVar3 = exr_get_tile_descriptor(f,iVar2,&local_2d0,local_25c,local_260,local_264),
              iVar3 != 0)) || (iVar3 = exr_get_tile_levels(f,iVar2,&local_2ac), iVar3 != 0)) {
LAB_0011196f:
            bVar6 = true;
            goto LAB_00111bb9;
          }
          if (0 < local_2b0) {
            bVar6 = true;
            uVar19 = 0;
            iVar3 = 0;
            do {
              if ((bVar6) && (0 < local_2ac)) {
                iVar15 = 0;
                local_2d4 = iVar3;
                do {
                  iVar3 = local_2d4;
                  uVar4 = exr_get_level_sizes(f,iVar2,iVar15,local_2d4,&local_2b4,&local_2b8);
                  if ((uVar4 == 0) &&
                     (uVar4 = exr_get_tile_sizes(f,iVar2,iVar15,iVar3,&local_2dc,&local_2c8),
                     uVar4 == 0)) {
                    local_2a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                    local_2a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                    local_2a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                    uVar19 = 0;
                    memset(&local_210,0,0x1e0);
                    if ((bVar6) && (0 < local_2b8)) {
                      uVar19 = 0;
                      lVar10 = 0;
                      iVar3 = 0;
                      local_278 = 0;
                      do {
                        local_270 = lVar10;
                        if ((bVar6) && (0 < local_2b4)) {
                          lVar10 = 0;
                          iVar16 = 0;
                          do {
                            uVar4 = exr_read_tile_chunk_info
                                              (f,iVar2,iVar16,iVar3,iVar15,local_2d4,&local_258);
                            if (uVar4 == 0) {
                              if (local_210 == 0) {
                                uVar5 = exr_decoding_initialize(f,iVar2,&local_258);
                                uVar19 = uVar5 & 0xffffffff;
                                if ((int)uVar5 != 0) goto LAB_00111f1f;
                                if (local_208 < 1) {
                                  sVar11 = 0;
                                }
                                else {
                                  uVar5 = 0x28;
                                  lVar14 = 0;
                                  sVar11 = 0;
                                  do {
                                    *(size_type *)(local_210 + uVar5) = sVar11 + 0x1000;
                                    sVar1 = *(short *)(local_210 + -0xc + uVar5);
                                    *(int *)(local_210 + -8 + uVar5) = (int)sVar1;
                                    *(int *)(local_210 + -4 + uVar5) = local_2dc * sVar1;
                                    sVar11 = (long)local_2c8 * (long)local_2dc * (long)sVar1 +
                                             sVar11;
                                    lVar14 = lVar14 + 1;
                                    uVar5 = uVar5 + 0x30;
                                  } while (lVar14 < local_208);
                                }
                                bVar13 = sVar11 < 1000000 | (byte)local_2d8;
                                local_278 = CONCAT71((int7)(uVar5 >> 8),bVar13);
                                if (bVar13 != 0) {
                                  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                            (&local_2a8,sVar11);
                                }
                                uVar4 = exr_decoding_choose_default_routines(f,iVar2,&local_210);
                                uVar19 = (ulong)uVar4;
                                if (uVar4 == 0) goto LAB_00111e76;
                                bVar6 = false;
                                break;
                              }
                              uVar4 = exr_decoding_update(f,iVar2,&local_258,&local_210);
                              if (uVar4 != 0) goto LAB_00111d2a;
                              uVar19 = 0;
LAB_00111e76:
                              if ((local_278 & 1) != 0) {
                                if (0 < local_208) {
                                  lVar14 = 0x28;
                                  lVar17 = 0;
                                  puVar7 = local_2a8.
                                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                           ._M_impl.super__Vector_impl_data._M_start;
                                  do {
                                    *(pointer *)(local_210 + lVar14) = puVar7;
                                    sVar1 = *(short *)(local_210 + -0xc + lVar14);
                                    *(int *)(local_210 + -8 + lVar14) = (int)sVar1;
                                    *(int *)(local_210 + -4 + lVar14) = local_2dc * sVar1;
                                    puVar7 = puVar7 + (long)local_2c8 * (long)local_2dc *
                                                      (long)sVar1;
                                    lVar17 = lVar17 + 1;
                                    lVar14 = lVar14 + 0x30;
                                  } while (lVar17 < local_208);
                                }
                                uVar4 = exr_decoding_run(f,iVar2,&local_210);
                                uVar19 = (ulong)uVar4;
                                if (reduceTime && uVar4 != 0) {
                                  bVar6 = false;
                                  break;
                                }
                              }
                            }
                            else {
LAB_00111d2a:
                              uVar19 = (ulong)uVar4;
                              if (reduceTime) {
LAB_00111f1f:
                                bVar6 = false;
                                break;
                              }
                            }
                            if (!bVar6) break;
                            lVar10 = lVar10 + local_2dc;
                            iVar16 = iVar16 + 1;
                          } while (lVar10 < local_2b4);
                        }
                        if (!bVar6) break;
                        lVar10 = local_270 + local_2c8;
                        iVar3 = iVar3 + 1;
                      } while (lVar10 < local_2b8);
                    }
                    exr_decoding_destroy(f,&local_210);
                    if (local_2a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                      operator_delete(local_2a8.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_start,
                                      (long)local_2a8.
                                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                      (long)local_2a8.
                                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                            ._M_impl.super__Vector_impl_data._M_start);
                    }
                    iVar16 = 0;
                  }
                  else {
                    uVar19 = (ulong)uVar4;
                    iVar16 = local_2c0;
                    if (reduceTime) {
                      bVar6 = false;
                    }
                  }
                  iVar3 = local_2d4;
                } while ((((iVar16 == 7) || (iVar16 == 0)) && (bVar6)) &&
                        (iVar15 = iVar15 + 1, iVar15 < local_2ac));
              }
            } while ((bVar6) && (iVar3 = iVar3 + 1, iVar3 < local_2b0));
            bVar6 = true;
            if ((int)uVar19 != 0) goto LAB_00111bb9;
          }
        }
        else if (local_2cc == 0) {
          iVar3 = exr_get_data_window(f,iVar2,&local_288);
          if (iVar3 != 0) goto LAB_0011196f;
          lVar10 = (long)local_280;
          lVar14 = (long)local_288;
          lVar17 = (long)local_27c;
          lVar18 = (long)local_284;
          local_2a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_2a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          local_2a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          memset(&local_210,0,0x1e0);
          iVar3 = exr_get_scanlines_per_chunk(f,iVar2,&local_2d0);
          bVar20 = true;
          if (iVar3 == 0) {
            if (lVar17 + 1 == lVar18) {
              bVar20 = false;
            }
            else {
              lVar10 = (lVar10 - lVar14) + 1;
              uVar19 = 0;
              bVar13 = 0;
              do {
                local_228 = 0;
                uStack_220 = 0;
                local_238 = 0;
                uStack_230 = 0;
                local_248 = 0;
                uStack_240 = 0;
                local_258 = 0;
                uStack_250 = 0;
                iVar3 = exr_read_scanline_chunk_info(f,iVar2,local_284 + (int)uVar19,&local_258);
                uVar4 = local_2c4;
                if (iVar3 == 0) {
                  if (local_210 == 0) {
                    iVar3 = exr_decoding_initialize(f,iVar2,&local_258);
                    if (iVar3 == 0) {
                      if (local_208 < 1) {
                        sVar11 = 0;
                      }
                      else {
                        lVar14 = 0x28;
                        lVar8 = 0;
                        sVar11 = 0;
                        do {
                          *(undefined8 *)(local_210 + lVar14) = 0x1000;
                          sVar1 = *(short *)(local_210 + -0xc + lVar14);
                          *(int *)(local_210 + -8 + lVar14) = (int)sVar1;
                          lVar12 = sVar1 * lVar10;
                          *(int *)(local_210 + -4 + lVar14) = (int)lVar12;
                          sVar11 = sVar11 + local_2d0 * lVar12;
                          lVar8 = lVar8 + 1;
                          lVar14 = lVar14 + 0x30;
                        } while (lVar8 < local_208);
                      }
                      bVar13 = sVar11 < 8000000 | (byte)local_2d8;
                      if (bVar13 != 0) {
                        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                  (&local_2a8,sVar11);
                      }
                      iVar3 = exr_decoding_choose_default_routines(f,iVar2,&local_210);
                      bVar6 = iVar3 != 0;
                      if (iVar3 == 0) goto LAB_00111a1f;
LAB_00111b69:
                      uVar4 = (uint)bVar6 * 2;
                    }
                    else {
                      uVar4 = 2;
                    }
                  }
                  else {
                    iVar3 = exr_decoding_update(f,iVar2,&local_258);
                    uVar4 = local_2c4;
                    if (iVar3 == 0) {
                      iVar3 = 0;
LAB_00111a1f:
                      uVar4 = 0;
                      if ((bVar13 & 1) != 0) {
                        if (0 < local_208) {
                          lVar14 = 0x28;
                          lVar8 = 0;
                          puVar7 = local_2a8.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_start;
                          do {
                            *(pointer *)(local_210 + lVar14) = puVar7;
                            sVar1 = *(short *)(local_210 + -0xc + lVar14);
                            *(int *)(local_210 + -8 + lVar14) = (int)sVar1;
                            lVar12 = sVar1 * lVar10;
                            *(int *)(local_210 + -4 + lVar14) = (int)lVar12;
                            puVar7 = puVar7 + local_2d0 * lVar12;
                            lVar8 = lVar8 + 1;
                            lVar14 = lVar14 + 0x30;
                          } while (lVar8 < local_208);
                        }
                        iVar3 = exr_decoding_run(f,iVar2,&local_210);
                        bVar6 = iVar3 != 0 && reduceTime;
                        goto LAB_00111b69;
                      }
                    }
                  }
                }
              } while (((uVar4 & 3) == 0) &&
                      (uVar19 = uVar19 + (long)local_2d0, uVar19 < (ulong)((lVar17 + 1) - lVar18)));
              bVar20 = iVar3 != 0;
            }
            exr_decoding_destroy(f,&local_210);
          }
          if (local_2a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_2a8.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (long)local_2a8.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_2a8.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          bVar6 = true;
          if (bVar20) goto LAB_00111bb9;
        }
        bVar6 = false;
      }
LAB_00111bb9:
      if (bVar6) {
        return bVar9;
      }
      iVar2 = iVar2 + 1;
      bVar9 = iVar2 < local_2bc;
    } while (iVar2 < local_2bc);
  }
  return bVar9;
}

Assistant:

bool
checkCoreFile (exr_context_t f, bool reduceMemory, bool reduceTime)
{
    exr_result_t rv;
    int          numparts;

    rv = exr_get_count (f, &numparts);
    if (rv != EXR_ERR_SUCCESS) return true;

    for (int p = 0; p < numparts; ++p)
    {
        exr_storage_t store;
        rv = exr_get_storage (f, p, &store);
        if (rv != EXR_ERR_SUCCESS) return true;

        // TODO: Need to fill this in
        if (store == EXR_STORAGE_DEEP_SCANLINE ||
            store == EXR_STORAGE_DEEP_TILED)
            continue;

        if (store == EXR_STORAGE_SCANLINE)
        {
            if (readCoreScanlinePart (f, p, reduceMemory, reduceTime))
                return true;
        }
        else if (store == EXR_STORAGE_TILED)
        {
            if (readCoreTiledPart (f, p, reduceMemory, reduceTime)) return true;
        }
    }

    return false;
}